

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackIFWGenerator::GetRootPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  cmCPackIFWPackage package;
  string local_230;
  cmCPackIFWPackage local_210;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"root","");
  paVar1 = &local_210.DisplayName.field_2;
  local_210.DisplayName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"CPACK_IFW_PACKAGE_GROUP","")
  ;
  pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_210.DisplayName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210.DisplayName._M_dataplus._M_p != paVar1) {
    operator_delete(local_210.DisplayName._M_dataplus._M_p,
                    local_210.DisplayName.field_2._M_allocated_capacity + 1);
  }
  if (pcVar3 == (char *)0x0) {
    local_210.DisplayName._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_210,"CPACK_IFW_PACKAGE_NAME","");
    pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_210.DisplayName);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210.DisplayName._M_dataplus._M_p != paVar1) {
      operator_delete(local_210.DisplayName._M_dataplus._M_p,
                      local_210.DisplayName.field_2._M_allocated_capacity + 1);
    }
    if (pcVar3 == (char *)0x0) {
      local_210.DisplayName._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"CPACK_PACKAGE_NAME","");
      pcVar3 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_210.DisplayName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210.DisplayName._M_dataplus._M_p != paVar1) {
        operator_delete(local_210.DisplayName._M_dataplus._M_p,
                        local_210.DisplayName.field_2._M_allocated_capacity + 1);
      }
      if (pcVar3 != (char *)0x0) {
        pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
        strlen(pcVar3);
        std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar3);
      }
    }
    else {
      pcVar2 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(pcVar3);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar2,(ulong)pcVar3);
    }
  }
  else {
    cmCPackIFWPackage::cmCPackIFWPackage(&local_210);
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    local_210.Generator = this;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,pcVar3,pcVar3 + sVar4);
    cmCPackIFWPackage::ConfigureFromGroup(&local_210,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    cmCPackIFWPackage::~cmCPackIFWPackage(&local_210);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetRootPackageName()
{
  // Default value
  std::string name = "root";
  if (const char* optIFW_PACKAGE_GROUP =
      this->GetOption("CPACK_IFW_PACKAGE_GROUP"))
    {
    // Configure from root group
    cmCPackIFWPackage package;
    package.Generator = this;
    package.ConfigureFromGroup(optIFW_PACKAGE_GROUP);
    name = package.Name;
    }
  else if (const char* optIFW_PACKAGE_NAME =
           this->GetOption("CPACK_IFW_PACKAGE_NAME"))
    {
    // Configure from root package name
    name = optIFW_PACKAGE_NAME;
    }
  else if (const char* optPACKAGE_NAME =
           this->GetOption("CPACK_PACKAGE_NAME"))
    {
    // Configure from package name
    name = optPACKAGE_NAME;
    }
  return name;
}